

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

waiter * nsync::nsync_waiter_new_(void)

{
  long lVar1;
  uint attempts;
  nsync_dll_element_ *e;
  waiter *container;
  waiter *pwVar2;
  long *in_FS_OFFSET;
  bool bVar3;
  
  lVar1 = *in_FS_OFFSET;
  pwVar2 = *(waiter **)(lVar1 + -8);
  if ((pwVar2 == (waiter *)0x0) || ((pwVar2->flags & 3U) != 1)) {
    attempts = 0;
    while ((free_waiters_mu & 1) != 0) {
      attempts = nsync_spin_delay_(attempts);
    }
    free_waiters_mu = free_waiters_mu | 1;
    LOCK();
    UNLOCK();
    e = nsync_dll_first_(free_waiters);
    if (e == (nsync_dll_element_ *)0x0) {
      free_waiters_mu = 0;
      if (nsync_malloc_ptr_ == (code *)0x0) {
        container = (waiter *)malloc(400);
      }
      else {
        container = (waiter *)(*nsync_malloc_ptr_)();
      }
      container->tag = 0x590239f;
      (container->nw).tag = 0x726d2ba9;
      nsync_mu_semaphore_init(&container->sem);
      (container->nw).sem = &container->sem;
      nsync_dll_init_(&(container->nw).q,&container->nw);
      LOCK();
      (container->nw).waiting.super___atomic_base<unsigned_int>._M_i = 0;
      UNLOCK();
      (container->nw).flags = 1;
      (container->remove_count).super___atomic_base<unsigned_int>._M_i = 0;
      nsync_dll_init_(&container->same_condition,container);
      container->flags = 0;
    }
    else {
      free_waiters = nsync_dll_remove_(free_waiters,e);
      container = (waiter *)((long)e->container + -0x108);
      free_waiters_mu = 0;
    }
    bVar3 = pwVar2 == (waiter *)0x0;
    pwVar2 = container;
    if (bVar3) {
      *(byte *)&container->flags = (byte)container->flags | 1;
      nsync_set_per_thread_waiter_(container,waiter_destroy);
      *(waiter **)(lVar1 + -8) = container;
    }
  }
  *(byte *)&pwVar2->flags = (byte)pwVar2->flags | 2;
  return pwVar2;
}

Assistant:

waiter *nsync_waiter_new_ (void) {
	nsync_dll_element_ *q;
	waiter *tw;
	waiter *w;
	if (HAVE_THREAD_LOCAL) {
		tw = waiter_for_thread;
	} else {
		tw = (waiter *) nsync_per_thread_waiter_ (&waiter_destroy);
	}
	w = tw;
	if (w == NULL || (w->flags & (WAITER_RESERVED|WAITER_IN_USE)) != WAITER_RESERVED) {
		w = NULL;
		nsync_spin_test_and_set_ (&free_waiters_mu, 1, 1, 0);
		q = nsync_dll_first_ (free_waiters);
		if (q != NULL) { /* If free list is non-empty, dequeue an item. */
			free_waiters = nsync_dll_remove_ (free_waiters, q);
			w = DLL_WAITER (q);
		}
		ATM_STORE_REL (&free_waiters_mu, 0); /* release store */
		if (w == NULL) { /* If free list was empty, allocate an item. */
			if (nsync_malloc_ptr_ != NULL) { /* Use client's malloc() */
				w = (waiter *) (*nsync_malloc_ptr_) (sizeof (*w));
			} else {  /* standard malloc () */
				w = (waiter *) malloc (sizeof (*w));
			}
			w->tag = WAITER_TAG;
			w->nw.tag = NSYNC_WAITER_TAG;
			nsync_mu_semaphore_init (&w->sem);
			w->nw.sem = &w->sem;
			nsync_dll_init_ (&w->nw.q, &w->nw);
			NSYNC_ATOMIC_UINT32_STORE_ (&w->nw.waiting, 0);
			w->nw.flags = NSYNC_WAITER_FLAG_MUCV;
			ATM_STORE (&w->remove_count, 0);
			nsync_dll_init_ (&w->same_condition, w);
			w->flags = 0;
		}
		if (tw == NULL) {
			w->flags |= WAITER_RESERVED;
			nsync_set_per_thread_waiter_ (w, &waiter_destroy);
			if (HAVE_THREAD_LOCAL) {
				waiter_for_thread = w;
			}
		}
	}
	w->flags |= WAITER_IN_USE;
	return (w);
}